

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::HasFieldValuePair
          (CrateReader *this,FieldValuePairVector *fvs,string *name,string *tyname)

{
  pointer ppVar1;
  size_t __n;
  vtable_type *pvVar2;
  bool bVar3;
  int iVar4;
  pointer ppVar5;
  bool bVar6;
  bool bVar7;
  string local_50;
  
  ppVar5 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar3 = ppVar5 != ppVar1;
    if (!bVar3) {
      return bVar3;
    }
    __n = (ppVar5->first)._M_string_length;
    if (__n == name->_M_string_length) {
      if (__n == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp((ppVar5->first)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      pvVar2 = (ppVar5->second).value_.v_.vtable;
      if (pvVar2 == (vtable_type *)0x0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
        local_50._M_string_length = 4;
        local_50.field_2._M_allocated_capacity._4_4_ =
             local_50.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      }
      else {
        (*pvVar2->type_name)(&local_50);
      }
      if (local_50._M_string_length != tyname->_M_string_length) goto LAB_001e44ec;
      if (local_50._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_50._M_dataplus._M_p,(tyname->_M_dataplus)._M_p,local_50._M_string_length)
        ;
        bVar7 = iVar4 == 0;
      }
    }
    else {
LAB_001e44ec:
      bVar7 = false;
    }
    if ((bVar6) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                               local_50.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (bVar7) {
      return bVar3;
    }
    ppVar5 = ppVar5 + 1;
  } while( true );
}

Assistant:

bool CrateReader::HasFieldValuePair(const FieldValuePairVector &fvs,
                                    const std::string &name,
                                    const std::string &tyname) {
  for (const auto &fv : fvs) {
    if ((fv.first == name) && (fv.second.type_name() == tyname)) {
      return true;
    }
  }

  return false;
}